

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

int create_413_response(http_response_old_t *res,http_request_old_t *req)

{
  int iVar1;
  char status_line [128];
  char local_88 [128];
  
  local_88[0x70] = '\0';
  local_88[0x71] = '\0';
  local_88[0x72] = '\0';
  local_88[0x73] = '\0';
  local_88[0x74] = '\0';
  local_88[0x75] = '\0';
  local_88[0x76] = '\0';
  local_88[0x77] = '\0';
  local_88[0x78] = '\0';
  local_88[0x79] = '\0';
  local_88[0x7a] = '\0';
  local_88[0x7b] = '\0';
  local_88[0x7c] = '\0';
  local_88[0x7d] = '\0';
  local_88[0x7e] = '\0';
  local_88[0x7f] = '\0';
  local_88[0x60] = '\0';
  local_88[0x61] = '\0';
  local_88[0x62] = '\0';
  local_88[99] = '\0';
  local_88[100] = '\0';
  local_88[0x65] = '\0';
  local_88[0x66] = '\0';
  local_88[0x67] = '\0';
  local_88[0x68] = '\0';
  local_88[0x69] = '\0';
  local_88[0x6a] = '\0';
  local_88[0x6b] = '\0';
  local_88[0x6c] = '\0';
  local_88[0x6d] = '\0';
  local_88[0x6e] = '\0';
  local_88[0x6f] = '\0';
  local_88[0x50] = '\0';
  local_88[0x51] = '\0';
  local_88[0x52] = '\0';
  local_88[0x53] = '\0';
  local_88[0x54] = '\0';
  local_88[0x55] = '\0';
  local_88[0x56] = '\0';
  local_88[0x57] = '\0';
  local_88[0x58] = '\0';
  local_88[0x59] = '\0';
  local_88[0x5a] = '\0';
  local_88[0x5b] = '\0';
  local_88[0x5c] = '\0';
  local_88[0x5d] = '\0';
  local_88[0x5e] = '\0';
  local_88[0x5f] = '\0';
  local_88[0x40] = '\0';
  local_88[0x41] = '\0';
  local_88[0x42] = '\0';
  local_88[0x43] = '\0';
  local_88[0x44] = '\0';
  local_88[0x45] = '\0';
  local_88[0x46] = '\0';
  local_88[0x47] = '\0';
  local_88[0x48] = '\0';
  local_88[0x49] = '\0';
  local_88[0x4a] = '\0';
  local_88[0x4b] = '\0';
  local_88[0x4c] = '\0';
  local_88[0x4d] = '\0';
  local_88[0x4e] = '\0';
  local_88[0x4f] = '\0';
  local_88[0x30] = '\0';
  local_88[0x31] = '\0';
  local_88[0x32] = '\0';
  local_88[0x33] = '\0';
  local_88[0x34] = '\0';
  local_88[0x35] = '\0';
  local_88[0x36] = '\0';
  local_88[0x37] = '\0';
  local_88[0x38] = '\0';
  local_88[0x39] = '\0';
  local_88[0x3a] = '\0';
  local_88[0x3b] = '\0';
  local_88[0x3c] = '\0';
  local_88[0x3d] = '\0';
  local_88[0x3e] = '\0';
  local_88[0x3f] = '\0';
  local_88[0x20] = '\0';
  local_88[0x21] = '\0';
  local_88[0x22] = '\0';
  local_88[0x23] = '\0';
  local_88[0x24] = '\0';
  local_88[0x25] = '\0';
  local_88[0x26] = '\0';
  local_88[0x27] = '\0';
  local_88[0x28] = '\0';
  local_88[0x29] = '\0';
  local_88[0x2a] = '\0';
  local_88[0x2b] = '\0';
  local_88[0x2c] = '\0';
  local_88[0x2d] = '\0';
  local_88[0x2e] = '\0';
  local_88[0x2f] = '\0';
  local_88[0x10] = '\0';
  local_88[0x11] = '\0';
  local_88[0x12] = '\0';
  local_88[0x13] = '\0';
  local_88[0x14] = '\0';
  local_88[0x15] = '\0';
  local_88[0x16] = '\0';
  local_88[0x17] = '\0';
  local_88[0x18] = '\0';
  local_88[0x19] = '\0';
  local_88[0x1a] = '\0';
  local_88[0x1b] = '\0';
  local_88[0x1c] = '\0';
  local_88[0x1d] = '\0';
  local_88[0x1e] = '\0';
  local_88[0x1f] = '\0';
  local_88[0] = '\0';
  local_88[1] = '\0';
  local_88[2] = '\0';
  local_88[3] = '\0';
  local_88[4] = '\0';
  local_88[5] = '\0';
  local_88[6] = '\0';
  local_88[7] = '\0';
  local_88[8] = '\0';
  local_88[9] = '\0';
  local_88[10] = '\0';
  local_88[0xb] = '\0';
  local_88[0xc] = '\0';
  local_88[0xd] = '\0';
  local_88[0xe] = '\0';
  local_88[0xf] = '\0';
  iVar1 = create_status_line(local_88,0x80,req->http_proto,Entity_Too_Large);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    fill_http_response(res,local_88);
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int create_413_response(http_response_old_t *res, const http_request_old_t* req)
{
  char status_line[128]={0};
  int ret;
  if((ret = create_status_line(status_line, 128, req->http_proto, Entity_Too_Large)) == -1)
    return -1;
  fill_http_response(res, status_line);

  return 0;
}